

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O2

ze_result_t
zetGetMetricGroupProcAddrTable(ze_api_version_t version,zet_metric_group_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  zet_pfnMetricGroupGetProperties_t p_Var3;
  int iVar4;
  ze_result_t zVar5;
  code *UNRECOVERED_JUMPTABLE;
  long lVar6;
  iterator __begin1;
  undefined8 *puVar7;
  bool bVar8;
  
  puVar7 = *(undefined8 **)(loader::context + 0x15e0);
  puVar1 = *(undefined8 **)(loader::context + 0x15e8);
  if (puVar1 != puVar7) {
    if (pDdiTable == (zet_metric_group_dditable_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (*(int *)(loader::context + 0x15c0) < (int)version) {
      return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    }
    bVar8 = false;
    for (; puVar7 != puVar1; puVar7 = puVar7 + 0x1b3) {
      if ((*(int *)(puVar7 + 1) == 0) &&
         (UNRECOVERED_JUMPTABLE = (code *)dlsym(*puVar7,"zetGetMetricGroupProcAddrTable"),
         UNRECOVERED_JUMPTABLE != (code *)0x0)) {
        iVar4 = (*UNRECOVERED_JUMPTABLE)(version,puVar7 + 0xed);
        if (iVar4 == 0) {
          bVar8 = true;
        }
        else {
          *(int *)(puVar7 + 1) = iVar4;
        }
      }
    }
    if (bVar8) {
      lVar2 = *(long *)(loader::context + 0x15e0);
      lVar6 = *(long *)(loader::context + 0x15e8) - lVar2;
      if (((ulong)(lVar6 / 0xd98) < 2) && (*(char *)(loader::context + 0x1629) != '\x01')) {
        pDdiTable->pfnCalculateMetricValues =
             *(zet_pfnMetricGroupCalculateMetricValues_t *)(lVar2 + 0x778);
        p_Var3 = *(zet_pfnMetricGroupGetProperties_t *)(lVar2 + 0x770);
        pDdiTable->pfnGet = *(zet_pfnMetricGroupGet_t *)(lVar2 + 0x768);
        pDdiTable->pfnGetProperties = p_Var3;
      }
      else {
        pDdiTable->pfnGet = loader::zetMetricGroupGet;
        pDdiTable->pfnGetProperties = loader::zetMetricGroupGetProperties;
        pDdiTable->pfnCalculateMetricValues = loader::zetMetricGroupCalculateMetricValues;
      }
      if (*(long *)(loader::context + 0x1618) != 0) {
        UNRECOVERED_JUMPTABLE =
             (code *)dlsym(*(long *)(loader::context + 0x1618),"zetGetMetricGroupProcAddrTable",
                           lVar6 % 0xd98);
        if (UNRECOVERED_JUMPTABLE == (code *)0x0) {
          return ZE_RESULT_ERROR_UNINITIALIZED;
        }
        zVar5 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
        return zVar5;
      }
      return ZE_RESULT_SUCCESS;
    }
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zetGetMetricGroupProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zet_metric_group_dditable_t* pDdiTable          ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zet_pfnGetMetricGroupProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zetGetMetricGroupProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.zet.MetricGroup);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGet                                      = loader::zetMetricGroupGet;
            pDdiTable->pfnGetProperties                            = loader::zetMetricGroupGetProperties;
            pDdiTable->pfnCalculateMetricValues                    = loader::zetMetricGroupCalculateMetricValues;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.zet.MetricGroup;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zet_pfnGetMetricGroupProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zetGetMetricGroupProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}